

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternEditor.cpp
# Opt level: O2

void __thiscall PatternEditor::transpose(PatternEditor *this)

{
  PatternModel *this_00;
  int iVar1;
  Object local_d8 [8];
  Object local_d0 [8];
  QSpinBox transposeSpin;
  QVBoxLayout layout;
  QLabel label;
  QDialog dialog;
  QDialogButtonBox buttons;
  
  QDialog::QDialog(&dialog,this,0x8003000);
  tr((QString *)&label,"Transpose",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)&dialog);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&label);
  QVBoxLayout::QVBoxLayout(&layout);
  tr((QString *)&transposeSpin,"Enter transpose amount (semitones):",(char *)0x0,-1);
  QLabel::QLabel(&label,&transposeSpin,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&transposeSpin);
  QSpinBox::QSpinBox(&transposeSpin,(QWidget *)0x0);
  QDialogButtonBox::QDialogButtonBox(&buttons,0x400400,0);
  QBoxLayout::addWidget(&layout,&label,0);
  QBoxLayout::addWidget(&layout,&transposeSpin,0);
  QBoxLayout::addWidget(&layout,&buttons,0);
  QLayout::setSizeConstraint((SizeConstraint)&layout);
  QWidget::setLayout((QLayout *)&dialog);
  QSpinBox::setRange((int)&transposeSpin,-0x53);
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_d0,(offset_in_QDialogButtonBox_to_subr)&buttons,
             (Object *)QDialogButtonBox::accepted,0,(ConnectionType)&dialog);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_d8,(offset_in_QDialogButtonBox_to_subr)&buttons,
             (Object *)QDialogButtonBox::rejected,0,(ConnectionType)&dialog);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  iVar1 = QDialog::exec();
  if (iVar1 == 1) {
    this_00 = this->mModel;
    iVar1 = QSpinBox::value();
    PatternModel::transpose(this_00,iVar1);
  }
  QDialogButtonBox::~QDialogButtonBox(&buttons);
  QSpinBox::~QSpinBox(&transposeSpin);
  QLabel::~QLabel(&label);
  QVBoxLayout::~QVBoxLayout(&layout);
  QDialog::~QDialog(&dialog);
  return;
}

Assistant:

void PatternEditor::transpose() {
    QDialog dialog(this, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint);
    dialog.setWindowTitle(tr("Transpose"));

    QVBoxLayout layout;
        QLabel label(tr("Enter transpose amount (semitones):"));
        QSpinBox transposeSpin;
        QDialogButtonBox buttons(QDialogButtonBox::Ok | QDialogButtonBox::Cancel);
    
    layout.addWidget(&label);
    layout.addWidget(&transposeSpin);
    layout.addWidget(&buttons);
    layout.setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    dialog.setLayout(&layout);

    transposeSpin.setRange(-trackerboy::NOTE_LAST, trackerboy::NOTE_LAST);

    connect(&buttons, &QDialogButtonBox::accepted, &dialog, &QDialog::accept);
    connect(&buttons, &QDialogButtonBox::rejected, &dialog, &QDialog::reject);

    if (dialog.exec() == QDialog::Accepted) {
        mModel.transpose(transposeSpin.value());
    }
}